

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::square(bigint *this)

{
  uint uVar1;
  int i;
  type tVar2;
  long lVar3;
  uint *puVar4;
  int j;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int value;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&n,&this->bigits_);
  sVar10 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar1 = (uint)sVar10;
  tVar2 = to_unsigned<int>(uVar1 * 2);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)tVar2);
  uVar8 = 0;
  uVar9 = 0;
  for (uVar11 = 0; puVar4 = n.super_buffer<unsigned_int>.ptr_, uVar5 = uVar11,
      (uint)uVar11 != (~((int)uVar1 >> 0x1f) & uVar1); uVar11 = uVar11 + 1) {
    for (; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
      bVar12 = CARRY8(uVar8,(ulong)n.super_buffer<unsigned_int>.ptr_[uVar5 & 0xffffffff] *
                            (ulong)*puVar4);
      uVar8 = uVar8 + (ulong)n.super_buffer<unsigned_int>.ptr_[uVar5 & 0xffffffff] * (ulong)*puVar4;
      uVar9 = uVar9 + bVar12;
      puVar4 = puVar4 + 1;
    }
    tVar2 = to_unsigned<int>((uint)uVar11);
    (this->bigits_).super_buffer<unsigned_int>.ptr_[tVar2] = (uint)uVar8;
    uVar8 = uVar8 >> 0x20 | uVar9 << 0x20;
    uVar9 = uVar9 >> 0x20;
  }
  iVar7 = 1;
  while (value = (int)sVar10, value < (int)(uVar1 * 2)) {
    lVar6 = (long)(int)(uVar1 - 1);
    for (lVar3 = (long)iVar7; lVar3 < (int)uVar1; lVar3 = lVar3 + 1) {
      puVar4 = n.super_buffer<unsigned_int>.ptr_ + lVar6;
      lVar6 = lVar6 + -1;
      bVar12 = CARRY8(uVar8,(ulong)*puVar4 * (ulong)n.super_buffer<unsigned_int>.ptr_[lVar3]);
      uVar8 = uVar8 + (ulong)*puVar4 * (ulong)n.super_buffer<unsigned_int>.ptr_[lVar3];
      uVar9 = uVar9 + bVar12;
    }
    tVar2 = to_unsigned<int>(value);
    iVar7 = iVar7 + 1;
    (this->bigits_).super_buffer<unsigned_int>.ptr_[tVar2] = (uint)uVar8;
    uVar8 = uVar8 >> 0x20 | uVar9 << 0x20;
    uVar9 = uVar9 >> 0x20;
    sVar10 = (size_t)(value + 1);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer(&n);
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }